

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_attr<tinyusdz::value::AssetPath>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *attr,
                   string *name,uint32_t indent)

{
  bool bVar1;
  AttrMeta *pAVar2;
  ostream *poVar3;
  value_type *pvVar4;
  TypedTimeSamples<tinyusdz::value::AssetPath> *v;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  size_type sVar5;
  const_reference v_00;
  undefined3 uVar6;
  uint32_t indent_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar7;
  uint32_t n;
  uint32_t extraout_EDX_01;
  uint32_t n_00;
  bool local_3ab;
  bool local_3aa;
  bool local_3a9;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_370;
  string local_350;
  string local_330 [32];
  string local_310;
  string local_2f0;
  string local_2d0;
  undefined1 local_2b0 [8];
  AssetPath a;
  string local_250;
  optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> local_230;
  optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *local_1c0;
  optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *pv;
  stringstream local_1b0 [3];
  bool is_timesamples;
  bool has_timesamples;
  bool has_default;
  bool is_connection;
  bool is_value_empty;
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *attr_local;
  
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)attr;
  attr_local = (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
               __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::authored
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)name_local
                    );
  if (bVar1) {
    pv._7_1_ = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::is_value_empty
                         ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                          name_local);
    pv._6_1_ = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::is_connection
                         ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                          name_local);
    pv._5_1_ = 0;
    pv._4_1_ = 0;
    pv._3_1_ = 0;
    TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::get_value
              (&local_230,
               (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)name_local);
    local_1c0 = &local_230;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    uVar6 = (undefined3)(indent >> 8);
    local_3a9 = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
               value(local_1c0);
      local_3a9 = Animatable<tinyusdz::value::AssetPath>::has_default(pvVar4);
    }
    pv._5_1_ = local_3a9;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    local_3aa = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
               value(local_1c0);
      local_3aa = Animatable<tinyusdz::value::AssetPath>::has_timesamples(pvVar4);
    }
    pv._4_1_ = local_3aa;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    indent_00 = CONCAT31(uVar6,bVar1);
    local_3ab = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
               value(local_1c0);
      local_3ab = Animatable<tinyusdz::value::AssetPath>::is_timesamples(pvVar4);
    }
    pv._3_1_ = local_3ab;
    pAVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::metas
                       ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                        name_local);
    bVar1 = AttrMetas::authored(pAVar2);
    uVar7 = extraout_EDX;
    if ((((bVar1) ||
         (bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::is_blocked
                            ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                             name_local), uVar7 = extraout_EDX_00, bVar1)) || ((pv._5_1_ & 1) != 0))
       || (((pv._7_1_ & 1) != 0 || (((pv._6_1_ & 1) == 0 && ((pv._3_1_ & 1) == 0)))))) {
      pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)local_24,uVar7);
      ::std::operator<<(aoStack_1a0,(string *)&local_250);
      ::std::__cxx11::string::~string((string *)&local_250);
      value::TypeTraits<tinyusdz::value::AssetPath>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)(a.resolved_path_.field_2._M_local_buf + 8));
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::__cxx11::string::~string((string *)(a.resolved_path_.field_2._M_local_buf + 8));
      bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::is_blocked
                        ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                         name_local);
      if (bVar1) {
        ::std::operator<<(aoStack_1a0," = None");
      }
      else if ((pv._5_1_ & 1) != 0) {
        value::AssetPath::AssetPath((AssetPath *)local_2b0);
        pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>
                 ::value(local_1c0);
        bVar1 = Animatable<tinyusdz::value::AssetPath>::get_scalar(pvVar4,(AssetPath *)local_2b0);
        if (bVar1) {
          poVar3 = ::std::operator<<(aoStack_1a0," = ");
          ::std::operator<<(poVar3,(AssetPath *)local_2b0);
        }
        else {
          ::std::operator<<(aoStack_1a0," = [InternalError]");
        }
        value::AssetPath::~AssetPath((AssetPath *)local_2b0);
      }
      pAVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::metas
                         ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                          name_local);
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = ::std::operator<<(aoStack_1a0,"(\n");
        pAVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::metas
                           ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                            name_local);
        print_attr_metas_abi_cxx11_
                  (&local_2d0,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),indent_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_2d0);
        pprint::Indent_abi_cxx11_(&local_2f0,(pprint *)(ulong)local_24,n);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_2f0);
        ::std::operator<<(poVar3,")");
        ::std::__cxx11::string::~string((string *)&local_2f0);
        ::std::__cxx11::string::~string((string *)&local_2d0);
      }
      ::std::operator<<(aoStack_1a0,"\n");
      uVar7 = extraout_EDX_01;
    }
    if ((pv._4_1_ & 1) != 0) {
      pprint::Indent_abi_cxx11_(&local_310,(pprint *)(ulong)local_24,uVar7);
      ::std::operator<<(aoStack_1a0,(string *)&local_310);
      ::std::__cxx11::string::~string((string *)&local_310);
      value::TypeTraits<tinyusdz::value::AssetPath>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,local_330);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::__cxx11::string::~string(local_330);
      poVar3 = ::std::operator<<(aoStack_1a0,".timeSamples = ");
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
               value(local_1c0);
      v = Animatable<tinyusdz::value::AssetPath>::get_timesamples(pvVar4);
      print_typed_timesamples<tinyusdz::value::AssetPath>(&local_350,v,local_24);
      ::std::operator<<(poVar3,(string *)&local_350);
      ::std::__cxx11::string::~string((string *)&local_350);
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::has_connections
                      ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                       name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_370,(pprint *)(ulong)local_24,n_00);
      ::std::operator<<(aoStack_1a0,(string *)&local_370);
      ::std::__cxx11::string::~string((string *)&local_370);
      value::TypeTraits<tinyusdz::value::AssetPath>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)&paths);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)psStack_20);
      ::std::__cxx11::string::~string((string *)&paths);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::get_connections
                       ((TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                        name_local);
      sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
      if (sVar5 == 1) {
        v_00 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this,0);
        ::std::operator<<(aoStack_1a0,v_00);
      }
      else {
        sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
        if (sVar5 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this);
        }
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::~optional
              (&local_230);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}